

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * fmt::v6::internal::
          parse_precision<wchar_t,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
                    *handler)

{
  specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *psVar1;
  int precision;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
  *psVar2;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
  *in_RDX;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
  *in_RSI;
  long in_RDI;
  wchar_t c;
  char *in_stack_ffffffffffffffa8;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
  *in_stack_ffffffffffffffb0;
  wchar_t *in_stack_ffffffffffffffb8;
  wchar_t local_34;
  precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
  local_30;
  undefined4 in_stack_ffffffffffffffd8;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
  *local_10;
  
  local_10 = (specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
              *)(in_RDI + 4);
  if (local_10 == in_RSI) {
    local_34 = L'\0';
  }
  else {
    local_34 = *(wchar_t *)
                &(local_10->
                 super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                 ).super_specs_setter<wchar_t>.specs_;
  }
  if ((local_34 < L'0') || (L'9' < local_34)) {
    if (local_34 != L'{') {
      specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
      ::on_error(&in_stack_ffffffffffffffb0->
                  super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                 ,in_stack_ffffffffffffffa8);
      return (wchar_t *)local_10;
    }
    psVar2 = (specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
              *)(in_RDI + 8);
    local_10 = psVar2;
    if (psVar2 != in_RSI) {
      precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
      ::precision_adapter(&local_30,in_RDX);
      local_10 = (specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
                  *)parse_arg_id<wchar_t,fmt::v6::internal::precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                              ((wchar_t *)in_RSI,(wchar_t *)in_RDX,
                               (precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                                *)CONCAT44(local_34,in_stack_ffffffffffffffd8));
      in_stack_ffffffffffffffb0 = psVar2;
    }
    if ((local_10 == in_RSI) ||
       (psVar2 = (specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
                  *)((long)&(local_10->
                            super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                            ).super_specs_setter<wchar_t>.specs_ + 4),
       psVar1 = &local_10->
                 super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
       , local_10 = psVar2, *(wchar_t *)&(psVar1->super_specs_setter<wchar_t>).specs_ != L'}')) {
      specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
      ::on_error(&in_stack_ffffffffffffffb0->
                  super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                 ,in_stack_ffffffffffffffa8);
      return (wchar_t *)local_10;
    }
  }
  else {
    precision = parse_nonnegative_int<wchar_t,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&>
                          ((wchar_t **)in_RDX,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    specs_setter<wchar_t>::on_precision((specs_setter<wchar_t> *)in_RDX,precision);
  }
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
  ::end_precision((specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
                   *)0x212c46);
  return (wchar_t *)local_10;
}

Assistant:

FMT_CONSTEXPR const Char* parse_precision(const Char* begin, const Char* end,
                                          Handler&& handler) {
  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    handler.on_precision(parse_nonnegative_int(begin, end, handler));
  } else if (c == '{') {
    ++begin;
    if (begin != end) {
      begin =
          parse_arg_id(begin, end, precision_adapter<Handler, Char>(handler));
    }
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}